

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTextureClampTests::init(SparseTextureClampTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  ShaderExtensionTestCase *this_00;
  TestNode *pTVar1;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (ShaderExtensionTestCase *)operator_new(0x98);
  context = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_ARB_sparse_texture_clamp",&local_41);
  ShaderExtensionTestCase::ShaderExtensionTestCase(this_00,context,&local_40);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = (TestNode *)operator_new(0x278);
  SparseTextureClampLookupResidencyTestCase::SparseTextureClampLookupResidencyTestCase
            ((SparseTextureClampLookupResidencyTestCase *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x278);
  SparseTextureClampLookupColorTestCase::SparseTextureClampLookupColorTestCase
            ((SparseTextureClampLookupColorTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampTests::init()
{
	addChild(new ShaderExtensionTestCase(m_context, "GL_ARB_sparse_texture_clamp"));
	addChild(new SparseTextureClampLookupResidencyTestCase(m_context));
	addChild(new SparseTextureClampLookupColorTestCase(m_context));
}